

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

ssize_t __thiscall
xs::MessageBuilder::read(MessageBuilder *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  RingBuffer<unsigned_char> *this_00;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  size_t sVar5;
  size_type sVar6;
  size_type extraout_RAX;
  undefined4 in_register_00000034;
  int curBufPos;
  size_t numToRead;
  size_t numBytesLeft;
  size_t msgSize;
  RingBuffer<unsigned_char> *local_18;
  ByteBuffer *src_local;
  MessageBuilder *this_local;
  
  local_18 = (RingBuffer<unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  src_local = (ByteBuffer *)this;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
  if (sVar3 < 8) {
    while( true ) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
      bVar1 = false;
      if (sVar3 < 8) {
        iVar2 = de::RingBuffer<unsigned_char>::getNumElements(local_18);
        bVar1 = 0 < iVar2;
      }
      if (!bVar1) break;
      msgSize._7_1_ = de::RingBuffer<unsigned_char>::popBack(local_18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->m_buffer,(value_type_conflict1 *)((long)&msgSize + 7));
    }
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    if (sVar3 == 8) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_buffer,0);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
      Message::parseHeader(pvVar4,(long)(int)sVar3,&this->m_messageType,&this->m_messageSize);
    }
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
  if (7 < sVar3) {
    sVar5 = getMessageSize(this);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    iVar2 = de::RingBuffer<unsigned_char>::getNumElements(local_18);
    iVar2 = de::min<int>(iVar2,(int)sVar5 - (int)sVar3);
    sVar3 = (size_type)iVar2;
    if (sVar3 != 0) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_buffer,(long)(int)sVar6 + sVar3);
      this_00 = local_18;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_buffer,(long)(int)sVar6);
      de::RingBuffer<unsigned_char>::popBack(this_00,pvVar4,iVar2);
      sVar3 = extraout_RAX;
    }
  }
  return sVar3;
}

Assistant:

void MessageBuilder::read (ByteBuffer& src)
{
	// Try to get header.
	if (m_buffer.size() < MESSAGE_HEADER_SIZE)
	{
		while (m_buffer.size() < MESSAGE_HEADER_SIZE &&
			   src.getNumElements() > 0)
			m_buffer.push_back(src.popBack());

		DE_ASSERT(m_buffer.size() <= MESSAGE_HEADER_SIZE);

		if (m_buffer.size() == MESSAGE_HEADER_SIZE)
		{
			// Got whole header, parse it.
			Message::parseHeader(&m_buffer[0], (int)m_buffer.size(), m_messageType, m_messageSize);
		}
	}

	if (m_buffer.size() >= MESSAGE_HEADER_SIZE)
	{
		// We have header.
		size_t msgSize			= getMessageSize();
		size_t numBytesLeft		= msgSize - m_buffer.size();
		size_t numToRead		= (size_t)de::min(src.getNumElements(), (int)numBytesLeft);

		if (numToRead > 0)
		{
			int curBufPos = (int)m_buffer.size();
			m_buffer.resize(curBufPos+numToRead);
			src.popBack(&m_buffer[curBufPos], (int)numToRead);
		}
	}
}